

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar * lodepng_chunk_next_const(uchar *chunk,uchar *end)

{
  uint uVar1;
  int iVar2;
  ulong local_30;
  size_t total_chunk_length;
  size_t available_size;
  uchar *end_local;
  uchar *chunk_local;
  
  total_chunk_length = (long)end - (long)chunk;
  chunk_local = end;
  if ((chunk < end) && (0xb < total_chunk_length)) {
    if ((((*chunk == 0x89) && (((chunk[1] == 'P' && (chunk[2] == 'N')) && (chunk[3] == 'G')))) &&
        (((chunk[4] == '\r' && (chunk[5] == '\n')) && (chunk[6] == '\x1a')))) && (chunk[7] == '\n'))
    {
      chunk_local = chunk + 8;
    }
    else {
      available_size = (size_t)end;
      end_local = chunk;
      uVar1 = lodepng_chunk_length(chunk);
      iVar2 = lodepng_addofl((ulong)uVar1,0xc,&local_30);
      if (iVar2 == 0) {
        if (total_chunk_length < local_30) {
          chunk_local = (uchar *)available_size;
        }
        else {
          chunk_local = end_local + local_30;
        }
      }
      else {
        chunk_local = (uchar *)available_size;
      }
    }
  }
  return chunk_local;
}

Assistant:

const unsigned char* lodepng_chunk_next_const(const unsigned char* chunk, const unsigned char* end) {
  size_t available_size = (size_t)(end - chunk);
  if(chunk >= end || available_size < 12) return end; /*too small to contain a chunk*/
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    size_t total_chunk_length;
    if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    if(total_chunk_length > available_size) return end; /*outside of range*/
    return chunk + total_chunk_length;
  }
}